

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

const_iterator * __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_3U>::const_iterator::operator++
          (const_iterator *this)

{
  pointer pEVar1;
  size_type sVar2;
  uint32_t uVar3;
  
  pEVar1 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar2 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  uVar3 = pEVar1[sVar2 - 1].offset + 1;
  pEVar1[sVar2 - 1].offset = uVar3;
  if ((uVar3 == pEVar1[sVar2 - 1].size) && (uVar3 = this->map->height, uVar3 != 0)) {
    IntervalMapDetails::Path::moveRight(&this->path,uVar3);
  }
  return this;
}

Assistant:

const_iterator& operator++() {
        SLANG_ASSERT(valid());
        if (++path.leafOffset() == path.leafSize() && !isFlat())
            path.moveRight(map->height);
        return *this;
    }